

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::Chebyshev
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  double local_60;
  double local_58;
  double local_50;
  REAL local_48;
  double local_40;
  ulong local_38;
  
  if (0 < num) {
    local_48 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (phi);
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (dphi);
    local_60 = 1.0;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_60);
    local_60 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_60);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&local_48);
      local_60 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      if (2 < (uint)num) {
        lVar5 = 0;
        local_38 = (ulong)(uint)num;
        do {
          lVar1 = lVar5 + 2;
          local_50 = local_48;
          lVar3 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 < lVar1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar2 = phi->fElem[lVar5 + 1];
          if (lVar3 <= lVar5) {
            local_58 = dVar2;
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_60 = (local_48 + local_48) * dVar2 - phi->fElem[lVar5];
          (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(phi,lVar1,0,&local_60);
          local_50 = local_48;
          lVar3 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < lVar1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_58 = dphi->fElem[lVar3 * (lVar5 + 1)];
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < lVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_40 = phi->fElem[lVar5 + 1];
          if ((lVar3 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_60 = (local_40 + local_40 + (local_48 + local_48) * local_58) -
                     dphi->fElem[lVar3 * lVar5];
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,lVar1,&local_60);
          uVar4 = lVar5 + 3;
          lVar5 = lVar5 + 1;
        } while (uVar4 != local_38);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
        phi.Zero();
        dphi.Zero();
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, x);
		dphi.Put(0,1, 1.0);
		int ord;
       // dphi.Print("DphisAntes = ",std::cout,EMathematicaInput);
    
		for(ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
		}
       // dphi.Print("DphisDepois = ",std::cout,EMathematicaInput);
	}